

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::updateNoClear(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,int p_col,
               number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *p_work,int *p_idx,int num)

{
  type_conflict5 tVar1;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  cpp_dec_float<100U,_int,_void> *in_RDI;
  int in_R8D;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rezi;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *lval;
  int *lidx;
  int j;
  int i;
  int ll;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffffae8;
  undefined1 local_508 [16];
  int in_stack_fffffffffffffb08;
  int in_stack_fffffffffffffb0c;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffb10;
  undefined1 local_4b8 [80];
  undefined1 local_468 [160];
  undefined1 local_3c8 [80];
  int local_378;
  undefined1 local_374 [80];
  undefined1 local_324 [80];
  int local_2d4;
  undefined1 local_2d0 [80];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_280;
  cpp_dec_float<100U,_int,_void> local_230;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1e0;
  long local_1d8;
  int local_1d0;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  long local_1c0;
  long local_1b8;
  int local_1ac;
  cpp_dec_float<100U,_int,_void> *local_1a0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_198;
  cpp_dec_float<100U,_int,_void> *local_190;
  undefined1 *local_188;
  cpp_dec_float<100U,_int,_void> *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  uint *local_168;
  undefined1 *local_160;
  cpp_dec_float<100U,_int,_void> *local_158;
  undefined1 *local_150;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_148;
  undefined1 *local_140;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_138;
  undefined1 *local_130;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_128;
  cpp_dec_float<100U,_int,_void> *local_120;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_118;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_109;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_108;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e0;
  undefined1 *local_d8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_c9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a0;
  undefined1 *local_98;
  long local_90;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_81;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_80;
  int *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  int *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  undefined1 *local_50;
  long local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  int *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  int *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  local_1a0 = &local_230;
  local_1c4 = in_R8D;
  local_1c0 = in_RCX;
  local_1b8 = in_RDX;
  local_1ac = in_ESI;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(in_RDI);
  local_198 = &local_280;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(in_RDI);
  local_2d4 = 1;
  local_80 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)(local_1b8 + (long)local_1ac * 0x50);
  local_70 = local_2d0;
  local_78 = &local_2d4;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_81,local_80);
  local_68 = local_2d0;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(in_RDI);
  local_50 = local_2d0;
  local_60 = local_78;
  local_90 = (long)*local_78;
  local_58 = local_80;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,long_long,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (in_RDI,(longlong *)in_stack_fffffffffffffae8,(cpp_dec_float<100U,_int,_void> *)0x540521
            );
  local_128 = &local_280;
  local_130 = local_2d0;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
            (in_RDI,in_stack_fffffffffffffae8);
  local_1c8 = makeLvec(in_stack_fffffffffffffb10,in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08
                      );
  local_1e0 = std::
              vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ::data((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      *)0x54058a);
  local_1d8 = *(long *)in_RDI[6].data._M_elems;
  while( true ) {
    local_1cc = local_1c4 + -1;
    local_1d0 = *(int *)(local_1c0 + (long)local_1cc * 4);
    if (local_1d0 == local_1ac) break;
    *(int *)(local_1d8 + (long)local_1c8 * 4) = local_1d0;
    local_c8 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)(local_1b8 + (long)local_1d0 * 0x50);
    local_b8 = local_324;
    local_c0 = &local_280;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_c9,local_c0,local_c8);
    local_b0 = local_324;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(in_RDI);
    local_98 = local_324;
    local_a0 = local_c0;
    local_a8 = local_c8;
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (in_RDI,in_stack_fffffffffffffae8,(cpp_dec_float<100U,_int,_void> *)0x5406c1);
    local_138 = local_1e0 + local_1c8;
    local_140 = local_324;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              (in_RDI,in_stack_fffffffffffffae8);
    local_1c8 = local_1c8 + 1;
    local_1c4 = local_1cc;
  }
  *(int *)(local_1d8 + (long)local_1c8 * 4) = local_1ac;
  local_378 = 1;
  local_28 = local_374;
  local_30 = &local_378;
  local_38 = &local_280;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_39,local_38);
  local_20 = local_374;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(in_RDI);
  local_8 = local_374;
  local_18 = local_30;
  local_48 = (long)*local_30;
  local_10 = local_38;
  boost::multiprecision::default_ops::
  eval_subtract<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,long_long,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (in_RDI,(longlong *)in_stack_fffffffffffffae8,(cpp_dec_float<100U,_int,_void> *)0x540813
            );
  local_148 = local_1e0 + local_1c8;
  local_150 = local_374;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
            (in_RDI,in_stack_fffffffffffffae8);
  local_1c8 = local_1c8 + 1;
  while (local_1cc = local_1cc + -1, -1 < local_1cc) {
    local_1d0 = *(int *)(local_1c0 + (long)local_1cc * 4);
    *(int *)(local_1d8 + (long)local_1c8 * 4) = local_1d0;
    local_108 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)(local_1b8 + (long)local_1d0 * 0x50);
    local_f8 = local_3c8;
    local_100 = &local_280;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_109,local_100,local_108);
    local_f0 = local_3c8;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(in_RDI);
    local_d8 = local_3c8;
    local_e0 = local_100;
    local_e8 = local_108;
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (in_RDI,in_stack_fffffffffffffae8,(cpp_dec_float<100U,_int,_void> *)0x540981);
    in_stack_fffffffffffffae8 = &local_230;
    local_160 = local_3c8;
    local_158 = in_stack_fffffffffffffae8;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              (in_RDI,in_stack_fffffffffffffae8);
    local_118 = local_1e0 + local_1c8;
    local_120 = in_stack_fffffffffffffae8;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              (in_RDI,in_stack_fffffffffffffae8);
    local_1c8 = local_1c8 + 1;
    local_188 = local_468;
    local_190 = &local_230;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              (in_RDI,in_stack_fffffffffffffae8);
    spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
              ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)in_stack_fffffffffffffae8);
    tVar1 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffffae8,
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x540a6b);
    if (tVar1) {
      local_178 = local_508;
      local_180 = &local_230;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                (in_RDI,in_stack_fffffffffffffae8);
      spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)in_stack_fffffffffffffae8);
      local_168 = in_RDI[1].data._M_elems + 3;
      local_170 = local_4b8;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                (in_RDI,in_stack_fffffffffffffae8);
    }
  }
  (in_RDI->data)._M_elems[0] = 0;
  return;
}

Assistant:

void CLUFactor<R>::updateNoClear(
   int p_col,
   const R* p_work,
   const int* p_idx,
   int num)
{
   int ll, i, j;
   int* lidx;
   R* lval;
   R x, rezi;

   assert(p_work[p_col] != 0.0);
   rezi = 1 / p_work[p_col];
   ll = makeLvec(num, p_col);
   //ll = fac->makeLvec(num, col);
   lval = l.val.data();
   lidx = l.idx;

   for(i = num - 1; (j = p_idx[i]) != p_col; --i)
   {
      lidx[ll] = j;
      lval[ll] = rezi * p_work[j];
      ++ll;
   }

   lidx[ll] = p_col;

   lval[ll] = 1 - rezi;
   ++ll;

   for(--i; i >= 0; --i)
   {
      j = p_idx[i];
      lidx[ll] = j;
      lval[ll] = x = rezi * p_work[j];
      ++ll;

      if(spxAbs(x) > maxabs)
         maxabs = spxAbs(x);
   }

   this->stat = SLinSolver<R>::OK;
}